

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O1

int __thiscall
CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf
          (map_bst<int,_int,_std::less<int>_> *this,node *n)

{
  node *n_00;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 1;
  while( true ) {
    if (n == (node *)0x0) {
      return iVar3 + -2;
    }
    n_00 = n->left;
    if (n_00 != (node *)0x0) break;
    if (n->right == (node *)0x0) goto LAB_001014d7;
    iVar3 = iVar3 + 1;
    n = n->right;
  }
  if (n->right == (node *)0x0) {
    iVar1 = shallowest_leaf(this,n_00);
    goto LAB_001014fe;
  }
LAB_001014d7:
  iVar1 = shallowest_leaf(this,n_00);
  iVar2 = shallowest_leaf(this,n->right);
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
LAB_001014fe:
  return iVar1 + iVar3;
}

Assistant:

int CP::map_bst<KeyT,MappedT,CompareT>::shallowest_leaf(node* n) {
  if (n == nullptr) return -1;
  if (n->left == nullptr && n->right != nullptr) return 1 + shallowest_leaf(n->right);
  if (n->left != nullptr && n->right == nullptr) return 1 + shallowest_leaf(n->left);
  return 1 + std::min(shallowest_leaf(n->left), shallowest_leaf(n->right));
}